

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::anon_unknown_12::ScanLineProcess::run_decode
          (ScanLineProcess *this,exr_const_context_t ctxt,int pn,DeepFrameBuffer *outfb,int fbY,
          int fbLastY,vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *filllist)

{
  int iVar1;
  IoExc *pIVar2;
  undefined8 in_RCX;
  undefined4 in_EDX;
  ScanLineProcess *in_RSI;
  int *in_RDI;
  uint8_t flags;
  DeepFrameBuffer *in_stack_00000068;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  DeepFrameBuffer *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar3;
  int fbY_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  fbY_00 = (int)((ulong)in_RCX >> 0x20);
  *in_RDI = 0x21;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    iVar1 = exr_decoding_update(in_RSI,in_EDX,in_RDI + 2,in_RDI + 0x12);
    if (iVar1 != 0) {
      pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar2,"Unable to update decode pipeline");
      __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
    bVar3 = (byte)*(undefined2 *)((long)in_RDI + 0x5a);
  }
  else {
    iVar1 = exr_decoding_initialize(in_RSI,in_EDX,in_RDI + 2,in_RDI + 0x12);
    if (iVar1 != 0) {
      pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar2,"Unable to initialize decode pipeline");
      __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 2;
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 1;
    bVar3 = 0;
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  if ((*(byte *)((long)in_RDI + 5) & 1) == 0) {
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) & 0xfffb;
  }
  else {
    *(ushort *)((long)in_RDI + 0x5a) = *(ushort *)((long)in_RDI + 0x5a) | 4;
  }
  update_pointers((ScanLineProcess *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  if (((ushort)bVar3 != *(ushort *)((long)in_RDI + 0x5a)) &&
     (iVar1 = exr_decoding_choose_default_routines(in_RSI,in_EDX,in_RDI + 0x12), iVar1 != 0)) {
    pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc(pIVar2,"Unable to choose decoder routines");
    __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
  }
  iVar1 = exr_decoding_run(in_RSI,in_EDX,in_RDI + 0x12);
  *in_RDI = iVar1;
  if (*in_RDI == 0) {
    copy_sample_count(in_RSI,(DeepFrameBuffer *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),fbY_00);
    if ((*(byte *)((long)in_RDI + 5) & 1) == 0) {
      run_fill((ScanLineProcess *)filllist,in_stack_00000068,this._4_4_,
               (vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *)ctxt);
    }
    return;
  }
  pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::IoExc::IoExc(pIVar2,"Unable to run decoder");
  __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
}

Assistant:

void ScanLineProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const DeepFrameBuffer *outfb,
    int fbY,
    int fbLastY,
    const std::vector<DeepSlice> &filllist)
{
    last_decode_err = EXR_ERR_UNKNOWN;
    uint8_t flags;

    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }
        decoder.decode_flags |= EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS;
        decoder.decode_flags |= EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL;
        flags = 0;
        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
        flags = decoder.decode_flags;
    }

    if (counts_only)
        decoder.decode_flags |= EXR_DECODE_SAMPLE_DATA_ONLY;
    else
        decoder.decode_flags = decoder.decode_flags & ~EXR_DECODE_SAMPLE_DATA_ONLY;

    update_pointers (outfb, fbY, fbLastY);

    if (flags != decoder.decode_flags)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    copy_sample_count (outfb, fbY);

    if (counts_only)
        return;

    run_fill (outfb, fbY, filllist);
}